

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CodeRhsOfIN(Parse *pParse,Expr *pExpr,int iTab)

{
  Vdbe *p_00;
  Expr *pEVar1;
  Select *p_01;
  ExprList *pEVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  KeyInfo *p_02;
  CollSeq *pCVar7;
  char *pcVar8;
  Expr *pE2;
  int r3;
  int r2;
  int r1;
  ExprList_item *pItem;
  ExprList *pList;
  int i_1;
  char affinity;
  Expr *p;
  undefined1 local_78 [4];
  int i;
  SelectDest dest;
  ExprList *pEList;
  Select *pSelect;
  Vdbe *v;
  int nVal;
  KeyInfo *pKeyInfo;
  Expr *pLeft;
  int local_20;
  int addr;
  int addrOnce;
  int iTab_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  local_20 = 0;
  p_00 = pParse->pVdbe;
  if (((pExpr->flags & 0x20) == 0) && (pParse->iSelfTab == 0)) {
    if ((pExpr->flags & 0x2000000) != 0) {
      iVar3 = sqlite3VdbeAddOp0(p_00,0x11);
      if ((pExpr->flags & 0x800) != 0) {
        sqlite3VdbeExplain(pParse,'\0',"REUSE LIST SUBQUERY %d",(ulong)((pExpr->x).pSelect)->selId);
      }
      sqlite3VdbeAddOp2(p_00,0xc,(pExpr->y).sub.regReturn,(pExpr->y).sub.iAddr);
      sqlite3VdbeAddOp2(p_00,0x6f,iTab,pExpr->iTable);
      sqlite3VdbeJumpHere(p_00,iVar3);
      return;
    }
    pExpr->flags = pExpr->flags | 0x2000000;
    iVar3 = pParse->nMem + 1;
    pParse->nMem = iVar3;
    (pExpr->y).sub.regReturn = iVar3;
    iVar3 = sqlite3VdbeAddOp2(p_00,0x46,0,(pExpr->y).sub.regReturn);
    (pExpr->y).sub.iAddr = iVar3 + 1;
    local_20 = sqlite3VdbeAddOp0(p_00,0x11);
  }
  pEVar1 = pExpr->pLeft;
  iVar3 = sqlite3ExprVectorSize(pEVar1);
  pExpr->iTable = iTab;
  iVar4 = sqlite3VdbeAddOp2(p_00,0x71,pExpr->iTable,iVar3);
  p_02 = sqlite3KeyInfoAlloc(pParse->db,iVar3,1);
  if ((pExpr->flags & 0x800) == 0) {
    if ((pExpr->x).pList != (ExprList *)0x0) {
      pEVar2 = (pExpr->x).pList;
      pList._7_1_ = sqlite3ExprAffinity(pEVar1);
      if (pList._7_1_ == '\0') {
        pList._7_1_ = 'A';
      }
      if (p_02 != (KeyInfo *)0x0) {
        pCVar7 = sqlite3ExprCollSeq(pParse,pExpr->pLeft);
        p_02->aColl[0] = pCVar7;
      }
      iVar3 = sqlite3GetTempReg(pParse);
      iVar5 = sqlite3GetTempReg(pParse);
      _r2 = pEVar2->a;
      for (pList._0_4_ = pEVar2->nExpr; 0 < (int)pList; pList._0_4_ = (int)pList + -1) {
        pEVar1 = _r2->pExpr;
        if ((local_20 != 0) && (iVar6 = sqlite3ExprIsConstant(pEVar1), iVar6 == 0)) {
          sqlite3VdbeChangeToNoop(p_00,local_20);
          pExpr->flags = pExpr->flags & 0xfdffffff;
          local_20 = 0;
        }
        iVar6 = sqlite3ExprCodeTarget(pParse,pEVar1,iVar3);
        sqlite3VdbeAddOp4(p_00,0x5c,iVar6,1,iVar5,(char *)((long)&pList + 7),1);
        sqlite3VdbeAddOp4Int(p_00,0x84,iTab,iVar5,iVar6,1);
        _r2 = _r2 + 1;
      }
      sqlite3ReleaseTempReg(pParse,iVar3);
      sqlite3ReleaseTempReg(pParse,iVar5);
    }
  }
  else {
    p_01 = (pExpr->x).pSelect;
    dest.pOrderBy = p_01->pEList;
    pcVar8 = "CORRELATED ";
    if (local_20 != 0) {
      pcVar8 = "";
    }
    sqlite3VdbeExplain(pParse,'\x01',"%sLIST SUBQUERY %d",pcVar8,(ulong)p_01->selId);
    if ((dest.pOrderBy)->nExpr == iVar3) {
      sqlite3SelectDestInit((SelectDest *)local_78,0xb,iTab);
      dest._8_8_ = exprINAffinity(pParse,pExpr);
      p_01->iLimit = 0;
      iVar5 = sqlite3Select(pParse,p_01,(SelectDest *)local_78);
      if (iVar5 != 0) {
        sqlite3DbFree(pParse->db,(void *)dest._8_8_);
        sqlite3KeyInfoUnref(p_02);
        return;
      }
      sqlite3DbFree(pParse->db,(void *)dest._8_8_);
      for (p._4_4_ = 0; p._4_4_ < iVar3; p._4_4_ = p._4_4_ + 1) {
        _i_1 = sqlite3VectorFieldSubexpr(pEVar1,p._4_4_);
        pCVar7 = sqlite3BinaryCompareCollSeq(pParse,_i_1,(dest.pOrderBy)->a[p._4_4_].pExpr);
        p_02->aColl[p._4_4_] = pCVar7;
      }
    }
  }
  if (p_02 != (KeyInfo *)0x0) {
    sqlite3VdbeChangeP4(p_00,iVar4,(char *)p_02,-9);
  }
  if (local_20 != 0) {
    sqlite3VdbeJumpHere(p_00,local_20);
    sqlite3VdbeAddOp1(p_00,0x42,(pExpr->y).sub.regReturn);
    iVar3 = (pExpr->y).sub.iAddr;
    iVar4 = sqlite3VdbeCurrentAddr(p_00);
    sqlite3VdbeChangeP1(p_00,iVar3 - 1,iVar4 + -1);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeRhsOfIN(
  Parse *pParse,          /* Parsing context */
  Expr *pExpr,            /* The IN operator */
  int iTab                /* Use this cursor number */
){
  int addrOnce = 0;           /* Address of the OP_Once instruction at top */
  int addr;                   /* Address of OP_OpenEphemeral instruction */
  Expr *pLeft;                /* the LHS of the IN operator */
  KeyInfo *pKeyInfo = 0;      /* Key information */
  int nVal;                   /* Size of vector pLeft */
  Vdbe *v;                    /* The prepared statement under construction */

  v = pParse->pVdbe;
  assert( v!=0 );

  /* The evaluation of the IN must be repeated every time it
  ** is encountered if any of the following is true:
  **
  **    *  The right-hand side is a correlated subquery
  **    *  The right-hand side is an expression list containing variables
  **    *  We are inside a trigger
  **
  ** If all of the above are false, then we can compute the RHS just once
  ** and reuse it many names.
  */
  if( !ExprHasProperty(pExpr, EP_VarSelect) && pParse->iSelfTab==0 ){
    /* Reuse of the RHS is allowed */
    /* If this routine has already been coded, but the previous code
    ** might not have been invoked yet, so invoke it now as a subroutine. 
    */
    if( ExprHasProperty(pExpr, EP_Subrtn) ){
      addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        ExplainQueryPlan((pParse, 0, "REUSE LIST SUBQUERY %d",
              pExpr->x.pSelect->selId));
      }
      sqlite3VdbeAddOp2(v, OP_Gosub, pExpr->y.sub.regReturn,
                        pExpr->y.sub.iAddr);
      sqlite3VdbeAddOp2(v, OP_OpenDup, iTab, pExpr->iTable);
      sqlite3VdbeJumpHere(v, addrOnce);
      return;
    }

    /* Begin coding the subroutine */
    ExprSetProperty(pExpr, EP_Subrtn);
    pExpr->y.sub.regReturn = ++pParse->nMem;
    pExpr->y.sub.iAddr =
      sqlite3VdbeAddOp2(v, OP_Integer, 0, pExpr->y.sub.regReturn) + 1;
    VdbeComment((v, "return address"));

    addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  }

  /* Check to see if this is a vector IN operator */
  pLeft = pExpr->pLeft;
  nVal = sqlite3ExprVectorSize(pLeft);

  /* Construct the ephemeral table that will contain the content of
  ** RHS of the IN operator.
  */
  pExpr->iTable = iTab;
  addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, pExpr->iTable, nVal);
#ifdef SQLITE_ENABLE_EXPLAIN_COMMENTS
  if( ExprHasProperty(pExpr, EP_xIsSelect) ){
    VdbeComment((v, "Result of SELECT %u", pExpr->x.pSelect->selId));
  }else{
    VdbeComment((v, "RHS of IN operator"));
  }
#endif
  pKeyInfo = sqlite3KeyInfoAlloc(pParse->db, nVal, 1);

  if( ExprHasProperty(pExpr, EP_xIsSelect) ){
    /* Case 1:     expr IN (SELECT ...)
    **
    ** Generate code to write the results of the select into the temporary
    ** table allocated and opened above.
    */
    Select *pSelect = pExpr->x.pSelect;
    ExprList *pEList = pSelect->pEList;

    ExplainQueryPlan((pParse, 1, "%sLIST SUBQUERY %d",
        addrOnce?"":"CORRELATED ", pSelect->selId
    ));
    /* If the LHS and RHS of the IN operator do not match, that
    ** error will have been caught long before we reach this point. */
    if( ALWAYS(pEList->nExpr==nVal) ){
      SelectDest dest;
      int i;
      sqlite3SelectDestInit(&dest, SRT_Set, iTab);
      dest.zAffSdst = exprINAffinity(pParse, pExpr);
      pSelect->iLimit = 0;
      testcase( pSelect->selFlags & SF_Distinct );
      testcase( pKeyInfo==0 ); /* Caused by OOM in sqlite3KeyInfoAlloc() */
      if( sqlite3Select(pParse, pSelect, &dest) ){
        sqlite3DbFree(pParse->db, dest.zAffSdst);
        sqlite3KeyInfoUnref(pKeyInfo);
        return;
      }
      sqlite3DbFree(pParse->db, dest.zAffSdst);
      assert( pKeyInfo!=0 ); /* OOM will cause exit after sqlite3Select() */
      assert( pEList!=0 );
      assert( pEList->nExpr>0 );
      assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
      for(i=0; i<nVal; i++){
        Expr *p = sqlite3VectorFieldSubexpr(pLeft, i);
        pKeyInfo->aColl[i] = sqlite3BinaryCompareCollSeq(
            pParse, p, pEList->a[i].pExpr
        );
      }
    }
  }else if( ALWAYS(pExpr->x.pList!=0) ){
    /* Case 2:     expr IN (exprlist)
    **
    ** For each expression, build an index key from the evaluation and
    ** store it in the temporary table. If <expr> is a column, then use
    ** that columns affinity when building index keys. If <expr> is not
    ** a column, use numeric affinity.
    */
    char affinity;            /* Affinity of the LHS of the IN */
    int i;
    ExprList *pList = pExpr->x.pList;
    struct ExprList_item *pItem;
    int r1, r2, r3;
    affinity = sqlite3ExprAffinity(pLeft);
    if( !affinity ){
      affinity = SQLITE_AFF_BLOB;
    }
    if( pKeyInfo ){
      assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
      pKeyInfo->aColl[0] = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
    }

    /* Loop through each expression in <exprlist>. */
    r1 = sqlite3GetTempReg(pParse);
    r2 = sqlite3GetTempReg(pParse);
    for(i=pList->nExpr, pItem=pList->a; i>0; i--, pItem++){
      Expr *pE2 = pItem->pExpr;

      /* If the expression is not constant then we will need to
      ** disable the test that was generated above that makes sure
      ** this code only executes once.  Because for a non-constant
      ** expression we need to rerun this code each time.
      */
      if( addrOnce && !sqlite3ExprIsConstant(pE2) ){
        sqlite3VdbeChangeToNoop(v, addrOnce);
        ExprClearProperty(pExpr, EP_Subrtn);
        addrOnce = 0;
      }

      /* Evaluate the expression and insert it into the temp table */
      r3 = sqlite3ExprCodeTarget(pParse, pE2, r1);
      sqlite3VdbeAddOp4(v, OP_MakeRecord, r3, 1, r2, &affinity, 1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iTab, r2, r3, 1);
    }
    sqlite3ReleaseTempReg(pParse, r1);
    sqlite3ReleaseTempReg(pParse, r2);
  }
  if( pKeyInfo ){
    sqlite3VdbeChangeP4(v, addr, (void *)pKeyInfo, P4_KEYINFO);
  }
  if( addrOnce ){
    sqlite3VdbeJumpHere(v, addrOnce);
    /* Subroutine return */
    sqlite3VdbeAddOp1(v, OP_Return, pExpr->y.sub.regReturn);
    sqlite3VdbeChangeP1(v, pExpr->y.sub.iAddr-1, sqlite3VdbeCurrentAddr(v)-1);
  }
}